

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfbs_gen_nim.cpp
# Opt level: O2

string * __thiscall
flatbuffers::anon_unknown_0::NimBfbsGenerator::AppendStructBuilderBody
          (string *__return_storage_ptr__,NimBfbsGenerator *this,Object *object,string *prefix)

{
  int32_t iVar1;
  _Any_data local_108;
  code *local_f8;
  code *pcStack_f0;
  string local_e0;
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  iVar1 = reflection::Object::minalign(object);
  NumToString<int>(&local_c0,iVar1);
  std::operator+(&local_a0,"  self.Prep(",&local_c0);
  std::operator+(&local_80,&local_a0,", ");
  iVar1 = reflection::Object::bytesize(object);
  NumToString<int>(&local_e0,iVar1);
  std::operator+(&local_60,&local_80,&local_e0);
  std::operator+(&local_40,&local_60,")\n");
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  local_108._M_unused._M_object = (void *)0x0;
  local_108._8_8_ = 0;
  local_f8 = (code *)0x0;
  pcStack_f0 = (code *)0x0;
  local_108._M_unused._M_object = operator_new(0x18);
  *(string **)local_108._M_unused._0_8_ = __return_storage_ptr__;
  *(NimBfbsGenerator **)((long)local_108._M_unused._0_8_ + 8) = this;
  *(string **)((long)local_108._M_unused._0_8_ + 0x10) = prefix;
  pcStack_f0 = std::
               _Function_handler<void_(const_reflection::Field_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/bfbs_gen_nim.cpp:384:44)>
               ::_M_invoke;
  local_f8 = std::
             _Function_handler<void_(const_reflection::Field_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/bfbs_gen_nim.cpp:384:44)>
             ::_M_manager;
  BaseBfbsGenerator::ForAllFields
            (&this->super_BaseBfbsGenerator,object,true,
             (function<void_(const_reflection::Field_*)> *)&local_108);
  std::_Function_base::~_Function_base((_Function_base *)&local_108);
  return __return_storage_ptr__;
}

Assistant:

std::string AppendStructBuilderBody(const r::Object *object,
                                      std::string prefix = "") const {
    std::string code;
    code += "  self.Prep(" + NumToString(object->minalign()) + ", " +
            NumToString(object->bytesize()) + ")\n";

    // We need to reverse the order we iterate over, since we build the
    // buffer backwards.
    ForAllFields(object, /*reverse=*/true, [&](const r::Field *field) {
      const int32_t num_padding_bytes = field->padding();
      if (num_padding_bytes) {
        code += "  self.Pad(" + NumToString(num_padding_bytes) + ")\n";
      }
      if (IsStructOrTable(field->type()->base_type())) {
        const r::Object *field_object = GetObject(field->type());
        code += AppendStructBuilderBody(field_object,
                                        prefix + namer_.Variable(*field) + "_");
      } else {
        code += "  self.Prepend(" + prefix + namer_.Variable(*field) + ")\n";
      }
    });

    return code;
  }